

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::get_deep_copy_method_call_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_type *ttype,
          bool *needs_typecast)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [16];
  allocator local_2d;
  t_base local_2c;
  bool *pbStack_28;
  t_base tbase;
  bool *needs_typecast_local;
  t_type *ttype_local;
  t_netstd_generator *this_local;
  
  pbStack_28 = needs_typecast;
  needs_typecast_local = (bool *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  needs_typecast_local = (bool *)resolve_typedef(ttype);
  *pbStack_28 = false;
  uVar2 = (*(((t_type *)needs_typecast_local)->super_t_doc)._vptr_t_doc[5])();
  if ((uVar2 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)needs_typecast_local + 0x50))();
    if ((uVar3 & 1) == 0) {
      bVar1 = (**(code **)(*(long *)needs_typecast_local + 0x68))();
      *pbStack_28 = (bool)(bVar1 ^ 1);
      std::operator+(&local_60,".",&DEEP_COPY_METHOD_NAME_abi_cxx11_);
      std::operator+(__return_storage_ptr__,&local_60,"()");
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_3f);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    }
  }
  else {
    local_2c = t_base_type::get_base((t_base_type *)needs_typecast_local);
    if (local_2c == TYPE_STRING) {
      uVar3 = (**(code **)(*(long *)needs_typecast_local + 0x38))();
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_3d);
        std::allocator<char>::~allocator((allocator<char> *)local_3d);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,".ToArray()",&local_2d);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::get_deep_copy_method_call(t_type* ttype, bool& needs_typecast)
{
    ttype = resolve_typedef(ttype);

    needs_typecast = false;
    if (ttype->is_base_type())
    {
        t_base_type::t_base tbase = static_cast<t_base_type*>(ttype)->get_base();
        switch (tbase)
        {
        case t_base_type::TYPE_STRING:
            if (ttype->is_binary())
            {
                return ".ToArray()";
            } else {
                return "";  // simple assignment will do, strings are immutable in C#
            }
            break;
        default:
            return "";  // simple assignment will do
        }
    }
    else if (ttype->is_enum())
    {
        return "";  // simple assignment will do
    }
    else
    {
        needs_typecast = (! ttype->is_container());
        return "." + DEEP_COPY_METHOD_NAME + "()";
    }
}